

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::python::Generator::FieldReferencingExpression_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,Descriptor *containing_type,
          FieldDescriptor *field,string_view python_dict_name)

{
  ushort *puVar1;
  string *psVar2;
  LogMessage *this_00;
  Nonnull<const_char_*> failure_msg;
  python *this_01;
  char *pcVar3;
  char *pcVar4;
  string_view v;
  string_view str;
  string_view v_00;
  string_view format;
  string_view name;
  string local_88;
  LogMessage local_68;
  size_t local_58;
  char *local_50;
  ulong local_48;
  long local_40;
  
  pcVar3 = python_dict_name._M_str;
  pcVar4 = pcVar3;
  if (field->file_ == this->file_) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                            (field->file_,this->file_,"field.file() == file_");
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    if (containing_type == (Descriptor *)0x0) {
      puVar1 = (ushort *)(field->all_names_).payload_;
      this_01 = (python *)(ulong)*puVar1;
      name._M_len = (long)puVar1 + ~(ulong)this_01;
      name._M_str = (char *)0x0;
      ResolveKeyword_abi_cxx11_(__return_storage_ptr__,this_01,name);
    }
    else {
      ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_88,this,containing_type);
      puVar1 = (ushort *)(field->all_names_).payload_;
      local_48 = (ulong)*puVar1;
      local_68._0_8_ = local_88._M_string_length;
      local_68.data_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                        )local_88._M_dataplus._M_p;
      local_40 = (long)puVar1 + ~local_48;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      format._M_str = (char *)&local_68;
      format._M_len = (size_t)"$0.$1[\'$2\']";
      local_58 = python_dict_name._M_len;
      local_50 = pcVar3;
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0xb,format,
                 (Nullable<const_absl::string_view_*>)0x3,(size_t)pcVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
             ,0x448,failure_msg);
  psVar2 = field->file_->name_;
  v._M_str = (psVar2->_M_dataplus)._M_p;
  v._M_len = psVar2->_M_string_length;
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_68,v);
  str._M_str = " vs. ";
  str._M_len = 5;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str);
  psVar2 = this->file_->name_;
  v_00._M_str = (psVar2->_M_dataplus)._M_p;
  v_00._M_len = psVar2->_M_string_length;
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v_00);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

std::string Generator::FieldReferencingExpression(
    const Descriptor* containing_type, const FieldDescriptor& field,
    absl::string_view python_dict_name) const {
  // We should only ever be looking up fields in the current file.
  // The only things we refer to from other files are message descriptors.
  ABSL_CHECK_EQ(field.file(), file_)
      << field.file()->name() << " vs. " << file_->name();
  if (!containing_type) {
    return ResolveKeyword(field.name());
  }
  return absl::Substitute("$0.$1['$2']",
                          ModuleLevelDescriptorName(*containing_type),
                          python_dict_name, field.name());
}